

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void ycc_rgb565_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                       JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  jpeg_color_deconverter *pjVar3;
  JSAMPLE *pJVar4;
  _func_void_j_decompress_ptr *p_Var5;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var6;
  _func_void_j_decompress_ptr *p_Var7;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var8;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  ulong uVar12;
  ushort *puVar13;
  byte *pbVar14;
  byte *pbVar15;
  uint local_7c;
  uint local_78;
  int local_74;
  JSAMPARRAY local_50;
  
  pjVar3 = cinfo->cconvert;
  local_7c = cinfo->output_width;
  pJVar4 = cinfo->sample_range_limit;
  p_Var5 = pjVar3[1].start_pass;
  p_Var6 = pjVar3[1].color_convert;
  p_Var7 = pjVar3[2].start_pass;
  p_Var8 = pjVar3[2].color_convert;
  local_78 = input_row;
  local_74 = num_rows;
  local_50 = output_buf;
  while (0 < local_74) {
    uVar9 = (ulong)local_78;
    pbVar15 = (*input_buf)[uVar9];
    pbVar14 = input_buf[1][uVar9];
    pbVar10 = input_buf[2][uVar9];
    puVar13 = (ushort *)*local_50;
    if (((ulong)puVar13 & 3) != 0) {
      uVar9 = (ulong)*pbVar15;
      pbVar15 = pbVar15 + 1;
      bVar1 = *pbVar14;
      pbVar14 = pbVar14 + 1;
      bVar2 = *pbVar10;
      pbVar10 = pbVar10 + 1;
      *puVar13 = (ushort)(pJVar4[(long)*(int *)(p_Var6 + (ulong)bVar1 * 4) + uVar9] >> 3) |
                 (pJVar4[(long)*(int *)(p_Var5 + (ulong)bVar2 * 4) + uVar9] & 0xfff8) * 0x100 +
                 (pJVar4[(long)(int)((ulong)(*(long *)(p_Var7 + (ulong)bVar2 * 8) +
                                            *(long *)(p_Var8 + (ulong)bVar1 * 8)) >> 0x10) + uVar9]
                 & 0xfc) * 8;
      puVar13 = puVar13 + 1;
      local_7c = local_7c - 1;
    }
    local_74 = local_74 + -1;
    local_78 = local_78 + 1;
    local_50 = local_50 + 1;
    for (lVar11 = 0; local_7c >> 1 != (uint)lVar11; lVar11 = lVar11 + 1) {
      uVar9 = (ulong)pbVar15[lVar11 * 2];
      uVar12 = (ulong)pbVar15[lVar11 * 2 + 1];
      *(uint *)(puVar13 + lVar11 * 2) =
           ((uint)(pJVar4[(long)*(int *)(p_Var6 + (ulong)pbVar14[lVar11 * 2 + 1] * 4) + uVar12] >> 3
                  ) |
           (pJVar4[(long)*(int *)(p_Var5 + (ulong)pbVar10[lVar11 * 2 + 1] * 4) + uVar12] & 0xf8) *
           0x100 + (pJVar4[(long)(int)((ulong)(*(long *)(p_Var7 + (ulong)pbVar10[lVar11 * 2 + 1] * 8
                                                        ) +
                                              *(long *)(p_Var8 + (ulong)pbVar14[lVar11 * 2 + 1] * 8)
                                              ) >> 0x10) + uVar12] & 0xfc) * 8) << 0x10 |
           (uint)(pJVar4[(long)*(int *)(p_Var6 + (ulong)pbVar14[lVar11 * 2] * 4) + uVar9] >> 3) |
           (pJVar4[(long)*(int *)(p_Var5 + (ulong)pbVar10[lVar11 * 2] * 4) + uVar9] & 0xf8) * 0x100
           + (pJVar4[(long)(int)((ulong)(*(long *)(p_Var7 + (ulong)pbVar10[lVar11 * 2] * 8) +
                                        *(long *)(p_Var8 + (ulong)pbVar14[lVar11 * 2] * 8)) >> 0x10)
                     + uVar9] & 0xfc) * 8;
    }
    if ((local_7c & 1) != 0) {
      uVar9 = (ulong)pbVar15[lVar11 * 2];
      puVar13[lVar11 * 2] =
           (ushort)(pJVar4[(long)*(int *)(p_Var6 + (ulong)pbVar14[lVar11 * 2] * 4) + uVar9] >> 3) |
           (pJVar4[(long)*(int *)(p_Var5 + (ulong)pbVar10[lVar11 * 2] * 4) + uVar9] & 0xfff8) *
           0x100 + (pJVar4[(long)(int)((ulong)(*(long *)(p_Var7 + (ulong)pbVar10[lVar11 * 2] * 8) +
                                              *(long *)(p_Var8 + (ulong)pbVar14[lVar11 * 2] * 8)) >>
                                      0x10) + uVar9] & 0xfc) * 8;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
ycc_rgb565_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                   JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    ycc_rgb565_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    ycc_rgb565_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}